

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void glcts::prepareDataForColorFloatTexture
               (Functions *gl,GLint cube_face,GLint element_index,GLint mipmap_level,
               GLint n_elements,GLint n_mipmap_levels,GLenum texture_format,GLenum texture_type,
               GLsizei texture_width,GLsizei texture_height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 local_18;
  float local_10;
  undefined4 local_c;
  
  auVar2._0_4_ = (float)n_mipmap_levels;
  auVar2._4_4_ = 0x40c00000;
  auVar2._8_8_ = 0;
  auVar1._0_4_ = (float)(mipmap_level + 1);
  auVar1._4_4_ = (float)(cube_face + 1);
  auVar1._8_4_ = 0x3f800000;
  auVar1._12_4_ = 0x3f800000;
  auVar2 = divps(auVar1,auVar2);
  local_18 = auVar2._0_8_;
  local_10 = (float)(element_index + 1) / (float)n_elements;
  local_c = 0x3e800000;
  prepareDataForTexture<float,4u>
            (gl,cube_face,element_index,mipmap_level,texture_format,texture_type,texture_width,
             texture_height,(float *)&local_18);
  return;
}

Assistant:

void prepareDataForColorFloatTexture(const glw::Functions& gl, glw::GLint cube_face, glw::GLint element_index,
									 glw::GLint mipmap_level, glw::GLint n_elements, glw::GLint n_mipmap_levels,
									 glw::GLenum texture_format, glw::GLenum texture_type, glw::GLsizei texture_width,
									 glw::GLsizei texture_height)
{
	glw::GLfloat components[4];

	getColorFloatComponents(cube_face, element_index, mipmap_level, n_elements, n_mipmap_levels, components);

	prepareDataForTexture<glw::GLfloat, 4>(gl, cube_face, element_index, mipmap_level, texture_format, texture_type,
										   texture_width, texture_height, components);
}